

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oracle.cc
# Opt level: O2

void __thiscall parser::KOracle::load_oracle(KOracle *this,string *file,bool is_training)

{
  Sentence *this_00;
  Dict *pDVar1;
  pointer pSVar2;
  uint __line;
  bool bVar3;
  __type _Var4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  istream *piVar8;
  long lVar9;
  undefined7 in_register_00000011;
  ulong uVar10;
  char *pcVar11;
  int *__x;
  int kTERM_INT;
  int kSHIFT_INT;
  int kREDUCE_INT;
  vector<int,_std::allocator<int>_> cur_acts;
  string line;
  string word;
  string kREDUCE;
  string kTERM;
  string kSHIFT;
  istrstream istr;
  compressed_ifstream in;
  
  poVar7 = std::operator<<((ostream *)&std::cerr,"Loading top-down oracle from ");
  poVar7 = std::operator<<(poVar7,(string *)file);
  poVar7 = std::operator<<(poVar7," [");
  pcVar11 = "non-training";
  if ((int)CONCAT71(in_register_00000011,is_training) != 0) {
    pcVar11 = "training";
  }
  poVar7 = std::operator<<(poVar7,pcVar11);
  std::operator<<(poVar7,"] ...\n");
  std::__cxx11::string::string((string *)&istr,(file->_M_dataplus)._M_p,(allocator *)&kREDUCE);
  cnn::compressed_ifstream::compressed_ifstream(&in,(string *)&istr);
  std::__cxx11::string::~string((string *)&istr);
  if (((&in.super_istream.field_0x20)[(long)in.super_istream._vptr_basic_istream[-3]] & 5) != 0) {
    pcVar11 = "in";
    __line = 0x2e;
LAB_00244b79:
    __assert_fail(pcVar11,
                  "/workspace/llm4binary/github/license_c_cmakelists/LeonCrashCode[P]InOrderParser/impl/oracle.cc"
                  ,__line,"void parser::KOracle::load_oracle(const string &, bool)");
  }
  std::__cxx11::string::string((string *)&kREDUCE,"REDUCE",(allocator *)&istr);
  std::__cxx11::string::string((string *)&kSHIFT,"SHIFT",(allocator *)&istr);
  std::__cxx11::string::string((string *)&kTERM,"TERM",(allocator *)&istr);
  pDVar1 = (this->super_Oracle).ad;
  std::__cxx11::string::string((string *)&istr,"REDUCE",(allocator *)&line);
  iVar5 = cnn::Dict::Convert(pDVar1,(string *)&istr);
  std::__cxx11::string::~string((string *)&istr);
  pDVar1 = (this->super_Oracle).ad;
  kREDUCE_INT = iVar5;
  std::__cxx11::string::string((string *)&istr,"SHIFT",(allocator *)&line);
  iVar5 = cnn::Dict::Convert(pDVar1,(string *)&istr);
  std::__cxx11::string::~string((string *)&istr);
  pDVar1 = (this->super_Oracle).ad;
  kSHIFT_INT = iVar5;
  std::__cxx11::string::string((string *)&istr,"TERM",(allocator *)&line);
  iVar6 = cnn::Dict::Convert(pDVar1,(string *)&istr);
  std::__cxx11::string::~string((string *)&istr);
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  cur_acts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cur_acts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  cur_acts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  iVar5 = 0;
  kTERM_INT = iVar6;
  do {
    do {
      iVar6 = iVar5;
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (&in.super_istream,(string *)&line);
      if (((&piVar8->field_0x20)[(long)piVar8->_vptr_basic_istream[-3]] & 5) != 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Loaded ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::operator<<(poVar7," sentences\n");
        poVar7 = std::operator<<((ostream *)&std::cerr,"    cumulative      action vocab size: ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::endl<char,std::char_traits<char>>(poVar7);
        poVar7 = std::operator<<((ostream *)&std::cerr,"    cumulative    terminal vocab size: ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::endl<char,std::char_traits<char>>(poVar7);
        poVar7 = std::operator<<((ostream *)&std::cerr,"    cumulative nonterminal vocab size: ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::endl<char,std::char_traits<char>>(poVar7);
        poVar7 = std::operator<<((ostream *)&std::cerr,"    cumulative         pos vocab size: ");
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
        std::endl<char,std::char_traits<char>>(poVar7);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&cur_acts.super__Vector_base<int,_std::allocator<int>_>);
        std::__cxx11::string::~string((string *)&line);
        std::__cxx11::string::~string((string *)&kTERM);
        std::__cxx11::string::~string((string *)&kSHIFT);
        std::__cxx11::string::~string((string *)&kREDUCE);
        cnn::compressed_ifstream::~compressed_ifstream(&in);
        return;
      }
      if (cur_acts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          cur_acts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        cur_acts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = cur_acts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      iVar5 = iVar6 + 1;
    } while ((line._M_string_length == 0) ||
            ((*line._M_dataplus._M_p == '#' && (line._M_dataplus._M_p[2] == '('))));
    std::vector<parser::Sentence,_std::allocator<parser::Sentence>_>::resize
              (&(this->super_Oracle).sents,
               ((long)(this->super_Oracle).sents.
                      super__Vector_base<parser::Sentence,_std::allocator<parser::Sentence>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->super_Oracle).sents.
                     super__Vector_base<parser::Sentence,_std::allocator<parser::Sentence>_>._M_impl
                     .super__Vector_impl_data._M_start) / 0x78 + 1);
    pSVar2 = (this->super_Oracle).sents.
             super__Vector_base<parser::Sentence,_std::allocator<parser::Sentence>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pDVar1 = (this->super_Oracle).pd;
    this_00 = pSVar2 + -1;
    if (is_training) {
      Oracle::ReadSentenceView(&line,pDVar1,&pSVar2[-1].pos);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (&in.super_istream,(string *)&line);
      Oracle::ReadSentenceView(&line,(this->super_Oracle).d,&this_00->raw);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (&in.super_istream,(string *)&line);
      Oracle::ReadSentenceView(&line,(this->super_Oracle).d,&pSVar2[-1].lc);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (&in.super_istream,(string *)&line);
      Oracle::ReadSentenceView(&line,(this->super_Oracle).d,&pSVar2[-1].unk);
    }
    else {
      Oracle::ReadSentenceView(&line,pDVar1,&pSVar2[-1].pos);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (&in.super_istream,(string *)&line);
      std::istrstream::istrstream(&istr,line._M_dataplus._M_p);
      word._M_dataplus._M_p = (pointer)&word.field_2;
      word._M_string_length = 0;
      word.field_2._M_local_buf[0] = '\0';
      while( true ) {
        piVar8 = std::operator>>((istream *)&istr,(string *)&word);
        if (((&piVar8->field_0x20)[(long)piVar8->_vptr_basic_istream[-3]] & 5) != 0) break;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pSVar2[-1].surfaces,&word);
      }
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (&in.super_istream,(string *)&line);
      Oracle::ReadSentenceView(&line,(this->super_Oracle).d,&pSVar2[-1].lc);
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                (&in.super_istream,(string *)&line);
      Oracle::ReadSentenceView(&line,(this->super_Oracle).d,&pSVar2[-1].unk);
      std::vector<int,_std::allocator<int>_>::operator=(&this_00->raw,&pSVar2[-1].unk);
      std::__cxx11::string::~string((string *)&word);
      std::istrstream::~istrstream(&istr);
    }
    iVar5 = iVar6 + 4;
    bVar3 = Sentence::SizesMatch(this_00);
    if (!bVar3) {
      poVar7 = std::operator<<((ostream *)&std::cerr,
                               "Mismatched lengths of input strings in oracle before line ");
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
      std::endl<char,std::char_traits<char>>(poVar7);
      goto LAB_00244ba6;
    }
    uVar10 = 0;
    while( true ) {
      piVar8 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         (&in.super_istream,(string *)&line);
      if (((&piVar8->field_0x20)[(long)piVar8->_vptr_basic_istream[-3]] & 5) != 0) break;
      if (line._M_string_length == 0) {
        iVar5 = iVar5 + 1;
        break;
      }
      lVar9 = std::__cxx11::string::find((char)&line,0x20);
      if (lVar9 != -1) {
        pcVar11 = "line.find(\' \') == string::npos";
        __line = 0x5d;
        goto LAB_00244b79;
      }
      _Var4 = std::operator==(&line,&kREDUCE);
      __x = &kREDUCE_INT;
      if (_Var4) {
LAB_002448f8:
        std::vector<int,_std::allocator<int>_>::push_back(&cur_acts,__x);
LAB_00244902:
        iVar5 = iVar5 + 1;
      }
      else {
        lVar9 = std::__cxx11::string::find((char *)&line,0x2d7c67);
        if (lVar9 == 0) {
          pDVar1 = this->nd;
          std::__cxx11::string::substr((ulong)&istr,(ulong)&line);
          cnn::Dict::Convert(pDVar1,(string *)&istr);
          std::__cxx11::string::~string((string *)&istr);
          _istr = cnn::Dict::Convert((this->super_Oracle).ad,&line);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>(&cur_acts,(int *)&istr);
          goto LAB_00244902;
        }
        _Var4 = std::operator==(&line,&kSHIFT);
        if (!_Var4) {
          _Var4 = std::operator==(&line,&kTERM);
          __x = &kTERM_INT;
          if (_Var4) goto LAB_002448f8;
          poVar7 = std::operator<<((ostream *)&std::cerr,"Malformed input in line ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5 + 1);
          std::endl<char,std::char_traits<char>>(poVar7);
          goto LAB_00244ba6;
        }
        std::vector<int,_std::allocator<int>_>::push_back(&cur_acts,&kSHIFT_INT);
        iVar5 = iVar5 + 1;
        uVar10 = (ulong)((int)uVar10 + 1);
      }
    }
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::push_back(&(this->super_Oracle).actions,&cur_acts);
    pSVar2 = (this->super_Oracle).sents.
             super__Vector_base<parser::Sentence,_std::allocator<parser::Sentence>_>._M_impl.
             super__Vector_impl_data._M_finish;
  } while ((long)pSVar2[-1].raw.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)pSVar2[-1].raw.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2 == uVar10);
  poVar7 = std::operator<<((ostream *)&std::cerr,
                           "Mismatched number of tokens and SHIFTs in oracle before line ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
  std::endl<char,std::char_traits<char>>(poVar7);
LAB_00244ba6:
  abort();
}

Assistant:

void KOracle::load_oracle(const string& file, bool is_training) {
  cerr << "Loading top-down oracle from " << file << " [" << (is_training ? "training" : "non-training") << "] ...\n";
  cnn::compressed_ifstream in(file.c_str());
  assert(in);
  const string kREDUCE = "REDUCE";
  const string kSHIFT = "SHIFT";
  const string kTERM = "TERM";
  const int kREDUCE_INT = ad->Convert("REDUCE");
  const int kSHIFT_INT = ad->Convert("SHIFT");
  const int kTERM_INT = ad->Convert("TERM");
  int lc = 0;
  string line;
  vector<int> cur_acts;
  while(getline(in, line)) {
    ++lc;
    //cerr << "line number = " << lc << endl;
    cur_acts.clear();
    if (line.size() == 0 || (line[0] == '#' && line[2] == '(')) continue;
    sents.resize(sents.size() + 1);
    auto& cur_sent = sents.back();
    if (is_training) {  // at training time, we load both "UNKified" versions of the data, and raw versions
      ReadSentenceView(line, pd, &cur_sent.pos);
      getline(in, line);
      ReadSentenceView(line, d, &cur_sent.raw);
      getline(in, line);
      ReadSentenceView(line, d, &cur_sent.lc);
      getline(in, line);
      ReadSentenceView(line, d, &cur_sent.unk);
    } else { // at test time, we ignore the raw strings and just use the "UNKified" versions
      ReadSentenceView(line, pd, &cur_sent.pos);
      getline(in, line);
      istrstream istr(line.c_str());
      string word;
      while(istr>>word) cur_sent.surfaces.push_back(word);
      getline(in, line);
      ReadSentenceView(line, d, &cur_sent.lc);
      getline(in, line);
      ReadSentenceView(line, d, &cur_sent.unk);
      cur_sent.raw = cur_sent.unk;
    }
    lc += 3;
    if (!cur_sent.SizesMatch()) {
      cerr << "Mismatched lengths of input strings in oracle before line " << lc << endl;
      abort();
    }
    int termc = 0;
    while(getline(in, line)) {
      ++lc;
      //cerr << "line number = " << lc << endl;
      if (line.size() == 0) break;
      assert(line.find(' ') == string::npos);
      if (line == kREDUCE) {
        cur_acts.push_back(kREDUCE_INT);
      } else if (line.find("PJ(") == 0) {
        // Convert NT
        nd->Convert(line.substr(3, line.size() - 4));
        // PJ(X) is put into the actions list as PJ(X)
        cur_acts.push_back(ad->Convert(line));
      } else if (line == kSHIFT) {
        cur_acts.push_back(kSHIFT_INT);
        termc++;
      } else if (line == kTERM){
	cur_acts.push_back(kTERM_INT);
      } else {
        cerr << "Malformed input in line " << lc << endl;
        abort();
      }
    }
    actions.push_back(cur_acts);
    if (termc != sents.back().size()) {
      cerr << "Mismatched number of tokens and SHIFTs in oracle before line " << lc << endl;
      abort();
    }
  }
  cerr << "Loaded " << sents.size() << " sentences\n";
  cerr << "    cumulative      action vocab size: " << ad->size() << endl;
  cerr << "    cumulative    terminal vocab size: " << d->size() << endl;
  cerr << "    cumulative nonterminal vocab size: " << nd->size() << endl;
  cerr << "    cumulative         pos vocab size: " << pd->size() << endl;
}